

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool ssl_cf_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  long *plVar1;
  long lVar2;
  char cVar3;
  _Bool _Var4;
  
  plVar1 = (long *)cf->ctx;
  lVar2 = plVar1[9];
  plVar1[9] = (long)data;
  if (*(code **)(*plVar1 + 0x40) != (code *)0x0) {
    cVar3 = (**(code **)(*plVar1 + 0x40))(cf,data);
    _Var4 = true;
    if (cVar3 != '\0') goto LAB_00176848;
  }
  _Var4 = (*cf->next->cft->has_data_pending)(cf->next,data);
LAB_00176848:
  *(long *)((long)cf->ctx + 0x48) = lVar2;
  return _Var4;
}

Assistant:

static bool ssl_cf_data_pending(struct Curl_cfilter *cf,
                                const struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct cf_call_data save;
  bool result;

  CF_DATA_SAVE(save, cf, data);
  if(connssl->ssl_impl->data_pending &&
     connssl->ssl_impl->data_pending(cf, data))
    result = TRUE;
  else
    result = cf->next->cft->has_data_pending(cf->next, data);
  CF_DATA_RESTORE(cf, save);
  return result;
}